

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_function_primitive_recompileAndOptimize
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong *puVar1;
  ulong uVar2;
  uint uVar3;
  sysbvm_tuple_t sVar4;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  puVar1 = (ulong *)*arguments;
  if (((ulong)puVar1 & 0xf) == 0 && puVar1 != (ulong *)0x0) {
    uVar2 = *puVar1;
    if (((uVar2 & 0xf) == 0 && uVar2 != 0) && ((*(byte *)(uVar2 + 8) & 0x80) == 0)) {
      uVar2 = *(ulong *)(uVar2 + 0x70);
      if (uVar2 == 0 || (uVar2 & 0xf) != 0) {
        uVar3 = (uint)((long)uVar2 >> 4);
      }
      else {
        uVar3 = (uint)*(undefined8 *)(uVar2 + 0x10);
      }
    }
    else {
      uVar3 = 0;
    }
    if ((uVar3 >> 0xc & 1) != 0) goto LAB_0011d56c;
  }
  sysbvm_error("Expected a function.");
LAB_0011d56c:
  if (((*(long *)(*arguments + 0x48) != 0) &&
      (uVar2 = *(ulong *)(*arguments + 0x38), (uVar2 & 0xf) == 0 && uVar2 != 0)) &&
     (7 < *(uint *)(uVar2 + 0xc))) {
    sVar4 = sysbvm_interpreter_recompileAndOptimizeFunction(context,(sysbvm_function_t **)arguments)
    ;
    return sVar4;
  }
  return *arguments;
}

Assistant:

static sysbvm_tuple_t sysbvm_function_primitive_recompileAndOptimize(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_tuple_t *function = &arguments[0];
    if(!sysbvm_tuple_isFunction(context, *function)) sysbvm_error("Expected a function.");
    
    sysbvm_function_t **functionObject = (sysbvm_function_t**)function;
    if((*functionObject)->definition && sysbvm_array_getSize((*functionObject)->captureVector) > 0)
        return sysbvm_interpreter_recompileAndOptimizeFunction(context, functionObject);
    
    return *function;
}